

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void mtree_quote(archive_string *s,char *str)

{
  byte bVar1;
  undefined1 local_24;
  char local_23;
  char local_22;
  char local_21;
  uchar c;
  char *pcStack_20;
  char buf [4];
  char *start;
  char *str_local;
  archive_string *s_local;
  
  pcStack_20 = str;
  for (start = str; *start != '\0'; start = start + 1) {
    if (""[(byte)*start] == '\0') {
      if (pcStack_20 != start) {
        archive_strncat(s,pcStack_20,(long)start - (long)pcStack_20);
      }
      bVar1 = *start;
      local_24 = 0x5c;
      local_23 = bVar1 / 0x40 + 0x30;
      local_22 = (char)(((ulong)bVar1 / 8) % 8) + '0';
      local_21 = bVar1 % 8 + 0x30;
      archive_strncat(s,&local_24,4);
      pcStack_20 = start + 1;
    }
  }
  if (pcStack_20 != start) {
    archive_strncat(s,pcStack_20,(long)start - (long)pcStack_20);
  }
  return;
}

Assistant:

static void
mtree_quote(struct archive_string *s, const char *str)
{
	const char *start;
	char buf[4];
	unsigned char c;

	for (start = str; *str != '\0'; ++str) {
		if (safe_char[*(const unsigned char *)str])
			continue;
		if (start != str)
			archive_strncat(s, start, str - start);
		c = (unsigned char)*str;
		buf[0] = '\\';
		buf[1] = (c / 64) + '0';
		buf[2] = (c / 8 % 8) + '0';
		buf[3] = (c % 8) + '0';
		archive_strncat(s, buf, 4);
		start = str + 1;
	}

	if (start != str)
		archive_strncat(s, start, str - start);
}